

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O0

void ImTui_ImplNcurses_DrawScreen(bool active)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  reference pvVar8;
  size_type sVar9;
  reference pvVar10;
  uchar *puVar11;
  byte in_DIL;
  uint16_t c;
  uint16_t p;
  uint16_t b;
  uint16_t f;
  TCell cell;
  int x_1;
  int lastp;
  int x;
  bool isSame;
  int y;
  int ic;
  bool compare;
  int ny;
  int nx;
  size_type in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  TScreen *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar12;
  undefined2 in_stack_ffffffffffffffcc;
  undefined2 in_stack_ffffffffffffffce;
  undefined2 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd2;
  undefined4 in_stack_ffffffffffffffd4;
  TCell TVar13;
  int local_28;
  uint local_24;
  int local_20;
  int local_18;
  int local_14;
  
  if ((in_DIL & 1) != 0) {
    nActiveFrames = 10;
  }
  wrefresh(_stdscr);
  iVar1 = g_screen->nx;
  iVar2 = g_screen->ny;
  bVar3 = true;
  if ((screenPrev.nx != iVar1) || (screenPrev.ny != iVar2)) {
    ImTui::TScreen::resize
              (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
               (int)in_stack_ffffffffffffffb8);
    bVar3 = false;
  }
  local_14 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,
                      CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)),
             CONCAT26(in_stack_ffffffffffffffce,
                      CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)));
  local_18 = 0;
  do {
    if (iVar2 <= local_18) {
      if (!bVar3) {
        memcpy(screenPrev.data,g_screen->data,(long)(iVar1 * iVar2) << 2);
      }
      bVar3 = 0 < nActiveFrames;
      nActiveFrames = nActiveFrames + -1;
      anon_unknown.dwarf_31576::VSync::wait(&g_vsync,(void *)(ulong)bVar3);
      return;
    }
    bVar4 = bVar3;
    if (bVar3) {
      for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
        if (screenPrev.data[local_18 * iVar1 + local_20] !=
            g_screen->data[local_18 * iVar1 + local_20]) {
          bVar4 = false;
          break;
        }
      }
    }
    if (!bVar4) {
      local_24 = 0xffffffff;
      move(local_18,0);
      for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
        TVar13 = g_screen->data[local_18 * iVar1 + local_28];
        uVar5 = (ushort)(TVar13 >> 0x10) & 0xff;
        uVar6 = (ushort)(byte)(TVar13 >> 0x18);
        uVar7 = uVar6 * 0x100 + uVar5;
        pvVar8 = std::array<std::pair<bool,_int>,_65536UL>::operator[]
                           ((array<std::pair<bool,_int>,_65536UL> *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8);
        if ((pvVar8->first & 1U) == 0) {
          init_pair((int)(short)nColPairs,(int)(short)uVar5,(int)(short)uVar6,(short)nColPairs);
          pvVar8 = std::array<std::pair<bool,_int>,_65536UL>::operator[]
                             ((array<std::pair<bool,_int>,_65536UL> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8);
          pvVar8->first = true;
          iVar12 = nColPairs;
          pvVar8 = std::array<std::pair<bool,_int>,_65536UL>::operator[]
                             ((array<std::pair<bool,_int>,_65536UL> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8);
          pvVar8->second = iVar12;
          nColPairs = nColPairs + 1;
        }
        if (local_24 != uVar7) {
          sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&curs);
          if (sVar9 != 0) {
            pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&curs,(long)local_14);
            *pvVar10 = '\0';
            sVar9 = _stdscr;
            puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12116c);
            waddnstr(sVar9,puVar11,0xffffffff);
            local_14 = 0;
            pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&curs,0);
            *pvVar10 = '\0';
          }
          sVar9 = _stdscr;
          pvVar8 = std::array<std::pair<bool,_int>,_65536UL>::operator[]
                             ((array<std::pair<bool,_int>,_65536UL> *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8);
          wattr_on(sVar9,(pvVar8->second & 0xffU) << 8,0);
          local_24 = (uint)uVar7;
        }
        if ((short)TVar13 == 0) {
          in_stack_ffffffffffffffb4 = 0x2e;
        }
        else {
          in_stack_ffffffffffffffb4 = TVar13 & 0xffff;
        }
        in_stack_ffffffffffffffb0 =
             CONCAT13((char)in_stack_ffffffffffffffb4,(int3)in_stack_ffffffffffffffb0);
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&curs,(long)local_14);
        *pvVar10 = (value_type)((uint)in_stack_ffffffffffffffb0 >> 0x18);
        local_14 = local_14 + 1;
      }
      sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&curs);
      if (sVar9 != 0) {
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&curs,(long)local_14);
        *pvVar10 = '\0';
        in_stack_ffffffffffffffa8 = _stdscr;
        puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x121286);
        waddnstr(in_stack_ffffffffffffffa8,puVar11,0xffffffff);
        local_14 = 0;
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&curs,0);
        *pvVar10 = '\0';
      }
      if (bVar3) {
        memcpy(screenPrev.data + local_18 * iVar1,g_screen->data + local_18 * iVar1,(long)iVar1 << 2
              );
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void ImTui_ImplNcurses_DrawScreen(bool active) {
    if (active) nActiveFrames = 10;

    wrefresh(stdscr);

    int nx = g_screen->nx;
    int ny = g_screen->ny;

    bool compare = true;

    if (screenPrev.nx != nx || screenPrev.ny != ny) {
        screenPrev.resize(nx, ny);
        compare = false;
    }

    int ic = 0;
    curs.resize(nx + 1);

    for (int y = 0; y < ny; ++y) {
        bool isSame = compare;
        if (compare) {
            for (int x = 0; x < nx; ++x) {
                if (screenPrev.data[y*nx + x] != g_screen->data[y*nx + x]) {
                    isSame = false;
                    break;
                }
            }
        }
        if (isSame) continue;

        int lastp = 0xFFFFFFFF;
        move(y, 0);
        for (int x = 0; x < nx; ++x) {
            auto cell = g_screen->data[y*nx + x];
            uint16_t f = (cell & 0x00FF0000) >> 16;
            uint16_t b = (cell & 0xFF000000) >> 24;
            uint16_t p = b*256 + f;

            if (colPairs[p].first == false) {
                init_pair(nColPairs, f, b);
                colPairs[p].first = true;
                colPairs[p].second = nColPairs;
                ++nColPairs;
            }

            if (lastp != (int) p) {
                if (curs.size() > 0) {
                    curs[ic] = 0;
                    addstr((char *) curs.data());
                    ic = 0;
                    curs[0] = 0;
                }
                attron(COLOR_PAIR(colPairs[p].second));
                lastp = p;
            }

            uint16_t c = cell & 0x0000FFFF;
            curs[ic++] = c > 0 ? c : '.';
        }

        if (curs.size() > 0) {
            curs[ic] = 0;
            addstr((char *) curs.data());
            ic = 0;
            curs[0] = 0;
        }

        if (compare) {
            memcpy(screenPrev.data + y*nx, g_screen->data + y*nx, nx*sizeof(ImTui::TCell));
        }
    }

    if (!compare) {
        memcpy(screenPrev.data, g_screen->data, nx*ny*sizeof(ImTui::TCell));
    }

    g_vsync.wait(nActiveFrames --> 0);
}